

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

int nk_strfmt(char *buf,int buf_size,char *fmt,__va_list_tag *args)

{
  double n;
  bool bVar1;
  byte bVar2;
  char cVar3;
  byte bVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  undefined8 in_RAX;
  ulong uVar10;
  int *piVar11;
  undefined4 *puVar12;
  byte *pbVar13;
  undefined8 *puVar14;
  ulong *puVar15;
  double *pdVar16;
  uint uVar17;
  long lVar18;
  undefined4 in_register_00000034;
  undefined8 uVar19;
  char *pcVar20;
  ulong uVar21;
  uint uVar22;
  ulong uVar23;
  int iVar24;
  long lVar25;
  long lVar26;
  byte *pbVar27;
  char cVar28;
  uint uVar29;
  long lVar30;
  char *end;
  char number_buffer [64];
  int local_cc;
  int local_b0;
  byte *local_88 [2];
  char local_78 [72];
  
  uVar29 = (uint)in_RAX;
  pbVar13 = (byte *)CONCAT44(in_register_00000034,buf_size);
  if (buf == (char *)0x0) {
    __assert_fail("buf",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x1be0,"int nk_strfmt(char *, int, const char *, struct __va_list_tag *)");
  }
  if (pbVar13 != (byte *)0x0) {
    uVar19 = CONCAT71((int7)((ulong)in_RAX >> 8),*pbVar13);
    uVar29 = (uint)uVar19;
    if (*pbVar13 != 0) {
      uVar17 = 0;
      bVar1 = false;
      uVar10 = 0;
LAB_00134531:
      iVar8 = (int)uVar10;
      lVar25 = (long)iVar8;
      uVar21 = 0xff - lVar25;
      lVar30 = lVar25 << 0x20;
      uVar23 = uVar10 & 0xffffffff;
      lVar18 = 0;
      pbVar27 = pbVar13;
      while( true ) {
        uVar29 = (uint)uVar19;
        pbVar27 = pbVar27 + 1;
        cVar3 = (char)uVar19;
        if ((cVar3 == '\0') || ((uVar29 & 0xff) == 0x25)) break;
        if (0x100 - lVar25 == lVar18) {
          buf = buf + 0xff;
          goto LAB_0013525c;
        }
        buf[lVar18 + lVar25] = cVar3;
        uVar19 = CONCAT71((int7)((ulong)uVar19 >> 8),pbVar13[lVar18 + 1]);
        lVar18 = lVar18 + 1;
        uVar21 = uVar21 - 1;
        lVar30 = lVar30 + 0x100000000;
        uVar23 = (ulong)((int)uVar23 + 1);
      }
      iVar24 = (int)lVar18;
      if ((cVar3 != '\0') && (lVar26 = lVar25 + lVar18, lVar26 < 0x100)) {
        uVar10 = (uVar10 & 0xffffffff) + lVar18;
        do {
          bVar4 = *pbVar27;
          if (bVar4 < 0x2b) {
            if (bVar4 == 0x20) {
              uVar29 = 4;
              bVar2 = 0;
            }
            else {
              if (bVar4 != 0x23) goto LAB_00134604;
              uVar29 = 0;
              bVar2 = 0;
            }
          }
          else if (bVar4 == 0x30) {
            uVar29 = 0x20;
            bVar2 = 0;
          }
          else {
            uVar29 = 0;
            bVar2 = 1;
            if (bVar4 != 0x2d) {
              if (bVar4 != 0x2b) goto LAB_00134604;
              uVar29 = 2;
              bVar2 = 0;
            }
          }
          uVar17 = uVar17 | uVar29;
          bVar1 = (bool)(bVar1 | bVar2);
          pbVar27 = pbVar27 + 1;
        } while( true );
      }
      uVar22 = iVar8 + iVar24;
LAB_0013527a:
      uVar29 = 0xff;
      if ((int)uVar22 < 0xff) {
        uVar29 = uVar22;
      }
      buf = buf + (int)uVar29;
    }
LAB_0013525c:
    *buf = '\0';
  }
  return uVar29;
LAB_00134604:
  if ((byte)(bVar4 - 0x31) < 9) {
    iVar6 = nk_strtoi((char *)pbVar27,(char **)local_88);
    pbVar13 = local_88[0];
    if (pbVar27 == local_88[0]) {
      iVar6 = -1;
    }
  }
  else {
    pbVar13 = pbVar27;
    iVar6 = -1;
    if (bVar4 == 0x2a) {
      uVar29 = *(uint *)fmt;
      if ((ulong)uVar29 < 0x29) {
        piVar11 = (int *)((ulong)uVar29 + *(long *)(fmt + 0x10));
        *(uint *)fmt = uVar29 + 8;
      }
      else {
        piVar11 = *(int **)(fmt + 8);
        *(int **)(fmt + 8) = piVar11 + 2;
      }
      pbVar13 = pbVar27 + 1;
      iVar6 = *piVar11;
    }
  }
  bVar4 = *pbVar13;
  local_cc = -1;
  if (bVar4 == 0x2e) {
    if (pbVar13[1] == 0x2a) {
      uVar29 = *(uint *)fmt;
      if ((ulong)uVar29 < 0x29) {
        piVar11 = (int *)((ulong)uVar29 + *(long *)(fmt + 0x10));
        *(uint *)fmt = uVar29 + 8;
      }
      else {
        piVar11 = *(int **)(fmt + 8);
        *(int **)(fmt + 8) = piVar11 + 2;
      }
      local_cc = *piVar11;
      pbVar13 = pbVar13 + 2;
    }
    else {
      pbVar27 = pbVar13 + 1;
      local_cc = nk_strtoi((char *)pbVar27,(char **)local_88);
      pbVar13 = local_88[0];
      if (local_88[0] == pbVar27) {
        local_cc = -1;
      }
    }
    bVar4 = *pbVar13;
  }
  if (bVar4 == 0x6c) {
    pbVar13 = pbVar13 + 1;
    puVar12 = (undefined4 *)0x3;
  }
  else {
    puVar12 = (undefined4 *)0x2;
    if (bVar4 == 0x68) {
      puVar12 = (undefined4 *)(ulong)(pbVar13[1] != 0x68);
      pbVar27 = pbVar13 + 1;
      if (pbVar13[1] != 0x68) {
        pbVar27 = pbVar13;
      }
      pbVar13 = pbVar27 + 1;
    }
  }
  bVar4 = *pbVar13;
  iVar7 = (int)puVar12;
  switch(bVar4) {
  case 99:
  case 100:
  case 0x69:
    iVar8 = (*(code *)(&DAT_001607e0 + *(int *)(&DAT_001607e0 + (long)puVar12 * 4)))();
    return iVar8;
  case 0x66:
    if (local_cc < 0) {
      local_cc = 6;
    }
    if (iVar6 < 1) {
      iVar6 = 0;
    }
    uVar29 = *(uint *)(fmt + 4);
    if ((ulong)uVar29 < 0xa1) {
      pdVar16 = (double *)((ulong)uVar29 + *(long *)(fmt + 0x10));
      *(uint *)(fmt + 4) = uVar29 + 0x10;
    }
    else {
      pdVar16 = *(double **)(fmt + 8);
      *(double **)(fmt + 8) = pdVar16 + 1;
    }
    if (iVar7 != 2) {
      __assert_fail("arg_type == NK_ARG_TYPE_DEFAULT",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                    ,0x1b9b,"int nk_vsnprintf(char *, int, const char *, struct __va_list_tag *)");
    }
    n = *pdVar16;
    nk_dtoa(local_78,n);
    cVar28 = local_78[0];
    lVar30 = 0;
    cVar3 = local_78[0];
    while (cVar3 != '\0') {
      lVar26 = lVar30 + 1;
      lVar30 = lVar30 + 1;
      cVar3 = local_78[lVar26];
    }
    lVar26 = 1;
    cVar3 = local_78[0];
    while ((cVar3 != '\0' && (cVar3 != '.'))) {
      pcVar20 = local_78 + lVar26;
      lVar26 = lVar26 + 1;
      cVar3 = *pcVar20;
    }
    iVar7 = (int)lVar26;
    if (cVar3 != '.') {
      iVar7 = 0;
    }
    iVar9 = (int)lVar30 - iVar7;
    if (local_cc < iVar9) {
      iVar9 = local_cc;
    }
    iVar6 = iVar6 - (iVar9 + iVar7);
    iVar7 = 0;
    if (0 < iVar6) {
      iVar7 = iVar6;
    }
    if (iVar6 < 2) {
      iVar6 = 1;
    }
    iVar6 = iVar6 + -1;
    if ((uVar17 & 6) == 0) {
      iVar6 = iVar7;
    }
    if (!bVar1) {
      if (iVar6 == 0) {
        iVar6 = -1;
      }
      else {
        uVar29 = iVar6 - 1;
        uVar23 = (ulong)uVar29;
        uVar10 = (-lVar18 - lVar25) + 0xff;
        if (uVar23 <= uVar10) {
          uVar10 = uVar23;
        }
        memset(buf + lVar18 + lVar25,(uVar17 & 0x20) >> 1 | 0x20,uVar10 + 1);
        local_b0 = (int)uVar10;
        iVar6 = (iVar6 - local_b0) + -2;
        if (uVar21 < uVar23) {
          uVar29 = (uint)uVar21;
        }
        uVar10 = (ulong)(uVar29 + iVar8 + iVar24 + 1);
      }
    }
    iVar8 = (int)uVar10;
    if (((((uVar17 & 2) != 0) && (0.0 <= n)) && (cVar3 = '+', iVar8 < 0x100)) ||
       ((((uVar17 & 4) != 0 && (0.0 <= n)) && (cVar3 = ' ', iVar8 < 0x100)))) {
      uVar10 = (ulong)(iVar8 + 1);
      buf[iVar8] = cVar3;
    }
    if (cVar28 == '\0') {
      iVar8 = 0;
      bVar5 = false;
    }
    else {
      bVar5 = false;
      pcVar20 = local_78;
      iVar8 = 0;
      do {
        pcVar20 = pcVar20 + 1;
        iVar8 = (iVar8 + 1) - (uint)!bVar5;
        iVar24 = (int)uVar10;
        if (iVar24 < 0x100) {
          uVar10 = (ulong)(iVar24 + 1);
          buf[iVar24] = cVar28;
        }
        if (cVar28 == '.') {
          bVar5 = true;
        }
      } while ((iVar8 < local_cc) && (cVar28 = *pcVar20, cVar28 != '\0'));
    }
    iVar24 = local_cc - iVar8;
    if (iVar24 != 0 && iVar8 <= local_cc) {
      do {
        if (bVar5) {
LAB_001351b1:
          bVar5 = true;
          iVar8 = (int)uVar10;
          if (iVar8 < 0x100) {
            uVar10 = (ulong)(iVar8 + 1);
            buf[iVar8] = '0';
          }
        }
        else {
          bVar5 = false;
          iVar8 = (int)uVar10;
          if (iVar8 < 0x100) {
            uVar10 = (ulong)(iVar8 + 1);
            buf[iVar8] = '.';
            goto LAB_001351b1;
          }
        }
        iVar24 = iVar24 + -1;
      } while (iVar24 != 0);
    }
    puVar12 = (undefined4 *)0x0;
    if (((bVar1) && (0 < iVar6)) && (iVar8 = (int)uVar10, iVar8 < 0x100)) {
      uVar22 = iVar6 - 1;
      uVar29 = 0xffU - iVar8;
      if (uVar22 < 0xffU - iVar8) {
        uVar29 = uVar22;
      }
      memset(buf + iVar8,0x20,(ulong)uVar29 + 1);
      puVar12 = (undefined4 *)(0xff - (long)iVar8);
      if ((undefined4 *)(ulong)uVar22 <= puVar12) {
        puVar12 = (undefined4 *)(ulong)uVar22;
      }
      uVar10 = (ulong)((int)puVar12 + iVar8 + 1);
    }
    break;
  case 0x6e:
    uVar29 = *(uint *)fmt;
    if ((ulong)uVar29 < 0x29) {
      puVar15 = (ulong *)((ulong)uVar29 + *(long *)(fmt + 0x10));
      *(uint *)fmt = uVar29 + 8;
    }
    else {
      puVar15 = *(ulong **)(fmt + 8);
      *(ulong **)(fmt + 8) = puVar15 + 1;
    }
    if (iVar7 != 2) {
      __assert_fail("arg_type == NK_ARG_TYPE_DEFAULT",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                    ,0x1b0a,"int nk_vsnprintf(char *, int, const char *, struct __va_list_tag *)");
    }
    if (local_cc != -1) {
      __assert_fail("precision == (-1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                    ,0x1b0b,"int nk_vsnprintf(char *, int, const char *, struct __va_list_tag *)");
    }
    if (iVar6 != -1) {
      __assert_fail("width == (-1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                    ,0x1b0c,"int nk_vsnprintf(char *, int, const char *, struct __va_list_tag *)");
    }
    puVar12 = (undefined4 *)*puVar15;
    if (puVar12 != (undefined4 *)0x0) {
      *puVar12 = (int)uVar10;
    }
    break;
  case 0x6f:
  case 0x75:
  case 0x78:
code_r0x001347f3:
    uVar19 = 0x10;
    if (bVar4 == 0x75) {
      uVar19 = 10;
    }
    if (bVar4 == 0x6f) {
      uVar19 = 8;
    }
    pcVar20 = "0123456789ABCDEF";
    if (bVar4 == 0x78) {
      pcVar20 = "0123456789abcdef";
    }
    iVar8 = (*(code *)(&DAT_001607d0 + *(int *)(&DAT_001607d0 + (long)puVar12 * 4)))(pcVar20,uVar19)
    ;
    return iVar8;
  case 0x73:
    uVar29 = *(uint *)fmt;
    if ((ulong)uVar29 < 0x29) {
      puVar14 = (undefined8 *)((ulong)uVar29 + *(long *)(fmt + 0x10));
      *(uint *)fmt = uVar29 + 8;
    }
    else {
      puVar14 = *(undefined8 **)(fmt + 8);
      *(undefined8 **)(fmt + 8) = puVar14 + 1;
    }
    pbVar27 = (byte *)*puVar14;
    if (pbVar27 == (byte *)buf) {
      __assert_fail("str != buf && \"buffer and argument are not allowed to overlap!\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                    ,0x1b00,"int nk_vsnprintf(char *, int, const char *, struct __va_list_tag *)");
    }
    if (iVar7 != 2) {
      __assert_fail("arg_type == NK_ARG_TYPE_DEFAULT",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                    ,0x1b01,"int nk_vsnprintf(char *, int, const char *, struct __va_list_tag *)");
    }
    if (local_cc != -1) {
      __assert_fail("precision == (-1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                    ,0x1b02,"int nk_vsnprintf(char *, int, const char *, struct __va_list_tag *)");
    }
    if (iVar6 != -1) {
      __assert_fail("width == (-1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                    ,0x1b03,"int nk_vsnprintf(char *, int, const char *, struct __va_list_tag *)");
    }
    if ((pbVar27 != (byte *)0x0) && (puVar12 = (undefined4 *)(ulong)*pbVar27, *pbVar27 != 0)) {
      do {
        pbVar27 = pbVar27 + 1;
        buf[lVar26] = (char)puVar12;
        puVar12 = (undefined4 *)(ulong)*pbVar27;
        uVar10 = (ulong)((int)uVar23 + 1);
        if (*pbVar27 == 0) break;
        bVar5 = lVar26 < 0xff;
        uVar23 = uVar10;
        lVar26 = lVar26 + 1;
      } while (bVar5);
    }
    break;
  default:
    if (bVar4 == 0x58) goto code_r0x001347f3;
    if (bVar4 == 0x25) {
      if (iVar7 != 2) {
        __assert_fail("arg_type == NK_ARG_TYPE_DEFAULT",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                      ,0x1af8,"int nk_vsnprintf(char *, int, const char *, struct __va_list_tag *)")
        ;
      }
      if (local_cc != -1) {
        __assert_fail("precision == (-1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                      ,0x1af9,"int nk_vsnprintf(char *, int, const char *, struct __va_list_tag *)")
        ;
      }
      if (iVar6 != -1) {
        __assert_fail("width == (-1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                      ,0x1afa,"int nk_vsnprintf(char *, int, const char *, struct __va_list_tag *)")
        ;
      }
      uVar10 = (ulong)(iVar8 + iVar24 + 1);
      buf[lVar30 >> 0x20] = '%';
      break;
    }
  case 0x65:
  case 0x67:
  case 0x68:
  case 0x6a:
  case 0x6b:
  case 0x6c:
  case 0x6d:
  case 0x70:
  case 0x71:
  case 0x72:
  case 0x74:
  case 0x76:
  case 0x77:
    __assert_fail("0 && \"specifier is not supported!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x1bd3,"int nk_vsnprintf(char *, int, const char *, struct __va_list_tag *)");
  }
  uVar22 = (uint)uVar10;
  uVar19 = CONCAT71((int7)((ulong)puVar12 >> 8),pbVar13[1]);
  if ((pbVar13[1] == 0) || (pbVar13 = pbVar13 + 1, 0xff < (int)uVar22)) goto LAB_0013527a;
  goto LAB_00134531;
}

Assistant:

NK_LIB int
nk_strfmt(char *buf, int buf_size, const char *fmt, va_list args)
{
    int result = -1;
    NK_ASSERT(buf);
    NK_ASSERT(buf_size);
    if (!buf || !buf_size || !fmt) return 0;
#ifdef NK_INCLUDE_STANDARD_IO
    result = NK_VSNPRINTF(buf, (nk_size)buf_size, fmt, args);
    result = (result >= buf_size) ? -1: result;
    buf[buf_size-1] = 0;
#else
    result = nk_vsnprintf(buf, buf_size, fmt, args);
#endif
    return result;
}